

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t functionExpression
          ,sysbvm_tuple_t arguments)

{
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).astFunctionApplicationNodeType,6);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].field_1.pointers[0] = functionExpression;
  psVar1[2].header.field_0.typePointer = arguments;
  psVar1[2].header.identityHashAndFlags = 0xb;
  psVar1[2].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astFunctionApplicationNode_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t functionExpression, sysbvm_tuple_t arguments)
{
    sysbvm_astFunctionApplicationNode_t *result = (sysbvm_astFunctionApplicationNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astFunctionApplicationNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astFunctionApplicationNode_t));
    result->super.sourcePosition = sourcePosition;
    result->functionExpression = functionExpression;
    result->arguments = arguments;
    result->applicationFlags = sysbvm_tuple_bitflags_encode(0);
    return (sysbvm_tuple_t)result;
}